

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.h
# Opt level: O0

int (anonymous_namespace)::lexical_cast<int,std::__cxx11::string>
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg)

{
  byte bVar1;
  ostream *poVar2;
  long *plVar3;
  int *piVar4;
  string *in_RDI;
  scoped_ptr<int> r;
  int result;
  stringstream interpreter;
  undefined7 in_stack_fffffffffffffe00;
  byte in_stack_fffffffffffffe07;
  scoped_ptr<int> local_1c0 [2];
  int local_19c;
  stringstream local_198 [16];
  ostream local_188 [388];
  int local_4;
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar2 = std::operator<<(local_188,in_RDI);
  bVar1 = std::ios::operator!((ios *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18)));
  if ((bVar1 & 1) == 0) {
    plVar3 = (long *)std::istream::operator>>(local_198,&local_19c);
    bVar1 = std::ios::operator!((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if ((bVar1 & 1) == 0) {
      std::istream::operator>>(local_198,std::ws<char,std::char_traits<char>>);
      in_stack_fffffffffffffe07 = std::ios::eof();
      if ((in_stack_fffffffffffffe07 & 1) != 0) {
        local_4 = local_19c;
        goto LAB_001d8c8b;
      }
    }
  }
  piVar4 = (int *)operator_new(4);
  *piVar4 = 0;
  MeCab::scoped_ptr<int>::scoped_ptr(local_1c0,piVar4);
  piVar4 = MeCab::scoped_ptr<int>::operator*(local_1c0);
  local_4 = *piVar4;
  MeCab::scoped_ptr<int>::~scoped_ptr
            ((scoped_ptr<int> *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
LAB_001d8c8b:
  std::__cxx11::stringstream::~stringstream(local_198);
  return local_4;
}

Assistant:

Target lexical_cast(Source arg) {
  std::stringstream interpreter;
  Target result;
  if (!(interpreter << arg) || !(interpreter >> result) ||
      !(interpreter >> std::ws).eof()) {
    MeCab::scoped_ptr<Target> r(new Target());  // return default value
    return *r;
  }
  return result;
}